

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O2

vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_> * __thiscall
rudp::session::update_ack
          (vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
           *__return_storage_ptr__,session *this,uint8_t new_acknowledge_head)

{
  byte bVar1;
  bool bVar2;
  difference_type __n;
  long lVar3;
  long lVar4;
  difference_type __d;
  ulong uVar5;
  byte bVar6;
  __shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var7;
  __shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  *this_00;
  long lVar8;
  long lVar9;
  __shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  local_48;
  ulong local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = this->acknowledge_head;
  uVar5 = (ulong)bVar1;
  if (((byte)(bVar1 - 1) != new_acknowledge_head) &&
     (bVar2 = is_valid_sequence_number(this,new_acknowledge_head), bVar2)) {
    bVar6 = new_acknowledge_head + 1;
    local_38 = (ulong)bVar6;
    if (bVar1 < bVar6) {
      p_Var7 = (__shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                *)((this->send_buffer)._M_elems + uVar5);
      lVar8 = 0;
      for (lVar3 = uVar5 * 0x30; local_38 * 0x30 - lVar3 != 0; lVar3 = lVar3 + 0x30) {
        lVar8 = (lVar8 + 1) -
                (ulong)(*(long *)((long)&(this->send_buffer)._M_elems[0].first.
                                         super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + lVar3) == 0);
      }
      for (lVar3 = local_38 * 0x30 + uVar5 * -0x30; lVar3 != 0; lVar3 = lVar3 + -0x30) {
        if (p_Var7->_M_ptr != (element_type *)0x0) {
          std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::
          push_back(__return_storage_ptr__,(value_type *)(p_Var7 + 1));
        }
        local_48._M_ptr = (element_type *)0x0;
        local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        __shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(p_Var7,&local_48);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
        p_Var7 = p_Var7 + 3;
      }
    }
    else if (bVar6 < bVar1) {
      p_Var7 = (__shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                *)&this->send_buffer;
      lVar4 = 0;
      for (lVar3 = uVar5 * 0x30; lVar3 != 0x3000; lVar3 = lVar3 + 0x30) {
        lVar4 = (lVar4 + 1) -
                (ulong)(*(long *)((long)&((array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
                                           *)p_Var7)->_M_elems[0].first.
                                         super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + lVar3) == 0);
      }
      lVar9 = local_38 * 0x30;
      lVar8 = 0;
      for (lVar3 = 0; lVar9 - lVar3 != 0; lVar3 = lVar3 + 0x30) {
        lVar8 = (lVar8 + 1) -
                (ulong)(*(long *)((long)&((array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
                                           *)p_Var7)->_M_elems[0].first.
                                         super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + lVar3) == 0);
      }
      lVar8 = lVar8 + lVar4;
      this_00 = (__shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                 *)((this->send_buffer)._M_elems + uVar5);
      for (lVar3 = uVar5 * -0x30 + 0x3000; lVar3 != 0; lVar3 = lVar3 + -0x30) {
        if (this_00->_M_ptr != (element_type *)0x0) {
          std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::
          push_back(__return_storage_ptr__,(value_type *)(this_00 + 1));
        }
        local_48._M_ptr = (element_type *)0x0;
        local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        __shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(this_00,&local_48);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
        this_00 = this_00 + 3;
      }
      for (; lVar9 != 0; lVar9 = lVar9 + -0x30) {
        if (p_Var7->_M_ptr != (element_type *)0x0) {
          std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::
          push_back(__return_storage_ptr__,(value_type *)(p_Var7 + 1));
        }
        local_48._M_ptr = (element_type *)0x0;
        local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        __shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(p_Var7,&local_48);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
        p_Var7 = p_Var7 + 3;
      }
    }
    else {
      lVar8 = 0;
    }
    this->unacknowledged_packet_count = this->unacknowledged_packet_count - lVar8;
    clear_retransmission_timer(this,this->acknowledge_head,(uint8_t)local_38);
    this->acknowledge_head = bVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< send_cb_t > session::update_ack( uint8_t new_acknowledge_head ) {
    std::vector< send_cb_t > cbs;
    if( new_acknowledge_head == uint8_t( acknowledge_head - 1u ) ) return cbs;
    if( !is_valid_sequence_number( new_acknowledge_head ) ) return cbs;
    ++new_acknowledge_head;
    size_t acknowledged_count = 0u;
    if( acknowledge_head < new_acknowledge_head ) {
      acknowledged_count = std::count_if( std::next( send_buffer.begin(), acknowledge_head ), std::next( send_buffer.begin(), new_acknowledge_head ), []( const auto &v ) -> bool { return static_cast< bool >( v.first ); } );
      std::for_each( std::next( send_buffer.begin(), acknowledge_head ), std::next( send_buffer.begin(), new_acknowledge_head ), [&]( auto &v ) {
        if( v.first ) cbs.push_back( v.second );
        v.first = buffer_ptr_t();
      } );
    }
    else if( acknowledge_head > new_acknowledge_head ) {
      acknowledged_count = std::count_if( std::next( send_buffer.begin(), acknowledge_head ), send_buffer.end(), []( const auto &v ) -> bool { return static_cast< bool >( v.first ); } );
      acknowledged_count += std::count_if( send_buffer.begin(), std::next( send_buffer.begin(), new_acknowledge_head ), []( const auto &v ) -> bool { return static_cast< bool >( v.first ); } );
      std::for_each( std::next( send_buffer.begin(), acknowledge_head ), send_buffer.end(), [&]( auto &v ) {
        if( v.first ) cbs.push_back( v.second );
        v.first = buffer_ptr_t();
      } );
      std::for_each( send_buffer.begin(), std::next( send_buffer.begin(), new_acknowledge_head ), [&]( auto &v ) {
        if( v.first ) cbs.push_back( v.second );
        v.first = buffer_ptr_t();
      } );
    }
    unacknowledged_packet_count -= acknowledged_count;
    clear_retransmission_timer( acknowledge_head, new_acknowledge_head );
    acknowledge_head = new_acknowledge_head;
    return cbs;
  }